

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modules.cpp
# Opt level: O0

Matrix3d *
opengv::relative_pose::modules::eigensolver::composeM
          (Matrix3d *xxF,Matrix3d *yyF,Matrix3d *zzF,Matrix3d *xyF,Matrix3d *yzF,Matrix3d *zxF,
          cayley_t *cayley)

{
  Scalar SVar1;
  Scalar *pSVar2;
  Matrix3d *in_RDI;
  Scalar row;
  DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *this;
  MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *other;
  DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *this_00;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
  *this_01;
  Scalar SVar3;
  Scalar SVar4;
  dense_product_base<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
  *this_02;
  StorageBaseType *matrix;
  double *scalar;
  double temp;
  rotation_t R;
  Matrix3d *M;
  DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>
  *in_stack_ffffffffffffe070;
  MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
  *in_stack_ffffffffffffe078;
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
  *in_stack_ffffffffffffe080;
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
  *in_stack_ffffffffffffe088;
  dense_product_base<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
  *in_stack_ffffffffffffe0a0;
  StorageBaseType *in_stack_ffffffffffffe0b0;
  double *in_stack_ffffffffffffe0b8;
  cayley_t *in_stack_ffffffffffffe148;
  
  Eigen::Matrix<double,_3,_3,_0,_3,_3>::Matrix((Matrix<double,_3,_3,_0,_3,_3> *)0x124687f);
  math::cayley2rot_reduced(in_stack_ffffffffffffe148);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row
            ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_ffffffffffffe080,
             (Index)in_stack_ffffffffffffe078);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)
             in_stack_ffffffffffffe080,
             (MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_ffffffffffffe078);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row
            ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_ffffffffffffe080,
             (Index)in_stack_ffffffffffffe078);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            (in_stack_ffffffffffffe070);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*(in_stack_ffffffffffffe080,in_stack_ffffffffffffe078);
  row = Eigen::internal::dense_product_base::operator_cast_to_double(in_stack_ffffffffffffe0a0);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
                      in_stack_ffffffffffffe070,(Index)row,0x124694f);
  *pSVar2 = row;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row
            ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_ffffffffffffe080,
             (Index)in_stack_ffffffffffffe078);
  Eigen::operator*(in_stack_ffffffffffffe0b8,in_stack_ffffffffffffe0b0);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)in_stack_ffffffffffffe088,
              (MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_ffffffffffffe080);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row
            ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_ffffffffffffe080,
             (Index)in_stack_ffffffffffffe078);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            (in_stack_ffffffffffffe070);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*(in_stack_ffffffffffffe088,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)in_stack_ffffffffffffe080);
  this = (DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)
         Eigen::internal::dense_product_base::operator_cast_to_double
                   ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                     *)in_stack_ffffffffffffe080);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,(Index)row,0x1246a42);
  *pSVar2 = (double)this + *pSVar2;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row
            ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_ffffffffffffe080,
             (Index)in_stack_ffffffffffffe078);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)
             in_stack_ffffffffffffe080,
             (MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_ffffffffffffe078);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row
            ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_ffffffffffffe080,
             (Index)in_stack_ffffffffffffe078);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*(in_stack_ffffffffffffe080,in_stack_ffffffffffffe078);
  other = (MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
          Eigen::internal::dense_product_base::operator_cast_to_double(in_stack_ffffffffffffe0a0);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,(Index)row,0x1246b0c);
  *pSVar2 = (double)other + *pSVar2;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row
            ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_ffffffffffffe080,
             (Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)
             in_stack_ffffffffffffe080,other);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row
            ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)in_stack_ffffffffffffe080,
             (Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*(in_stack_ffffffffffffe080,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other);
  this_00 = (DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
            Eigen::internal::dense_product_base::operator_cast_to_double(in_stack_ffffffffffffe0a0);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,(Index)row,0x1246bd7);
  *pSVar2 = (Scalar)this_00;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::operator*(in_stack_ffffffffffffe0b8,in_stack_ffffffffffffe0b0);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)in_stack_ffffffffffffe088,
              (MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*(in_stack_ffffffffffffe088,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)this_00);
  this_01 = (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
             *)Eigen::internal::dense_product_base::operator_cast_to_double
                         ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                           *)this_00);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,(Index)row,0x1246ccd);
  *pSVar2 = (double)this_01 + *pSVar2;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::operator*(in_stack_ffffffffffffe0b8,in_stack_ffffffffffffe0b0);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_01,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_01,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)this_00);
  SVar3 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)this_00);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,(Index)row,0x1246dc6);
  *pSVar2 = SVar3 + *pSVar2;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this_00
             ,other);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other);
  SVar4 = Eigen::internal::dense_product_base::operator_cast_to_double(in_stack_ffffffffffffe0a0);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,(Index)row,0x1246e92);
  *pSVar2 = SVar4 + *pSVar2;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this_00
             ,other);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other);
  this_02 = (dense_product_base<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
             *)Eigen::internal::dense_product_base::operator_cast_to_double
                         (in_stack_ffffffffffffe0a0);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,(Index)row,0x1246f5e);
  *pSVar2 = (Scalar)this_02;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::operator*(in_stack_ffffffffffffe0b8,in_stack_ffffffffffffe0b0);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_01,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_01,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)this_00);
  SVar3 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)this_00);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,(Index)row,0x1247053);
  *pSVar2 = SVar3 + *pSVar2;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::operator*(in_stack_ffffffffffffe0b8,in_stack_ffffffffffffe0b0);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_01,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_01,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)this_00);
  matrix = (StorageBaseType *)
           Eigen::internal::dense_product_base::operator_cast_to_double
                     ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                       *)this_00);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,(Index)row,0x124714d);
  *pSVar2 = (double)matrix + *pSVar2;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this_00
             ,other);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other);
  scalar = (double *)Eigen::internal::dense_product_base::operator_cast_to_double(this_02);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,(Index)row,0x1247218);
  *pSVar2 = (double)scalar + *pSVar2;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this_00
             ,other);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other);
  SVar4 = Eigen::internal::dense_product_base::operator_cast_to_double(this_02);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,(Index)row,0x12472e1);
  *pSVar2 = SVar4;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_01,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_01,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)this_00);
  SVar3 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)this_00);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,(Index)row,0x12473d5);
  *pSVar2 = SVar3 + *pSVar2;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this_00
             ,other);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other);
  SVar4 = Eigen::internal::dense_product_base::operator_cast_to_double(this_02);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,(Index)row,0x12474a0);
  *pSVar2 = SVar4 + *pSVar2;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this_00
             ,other);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other);
  SVar4 = Eigen::internal::dense_product_base::operator_cast_to_double(this_02);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,(Index)row,0x124756c);
  *pSVar2 = SVar4;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_01,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_01,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)this_00);
  SVar3 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)this_00);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,(Index)row,0x1247661);
  *pSVar2 = SVar3 + *pSVar2;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_01,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_01,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)this_00);
  SVar3 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)this_00);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,(Index)row,0x124775f);
  *pSVar2 = SVar3 + *pSVar2;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this_00
             ,other);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other);
  SVar4 = Eigen::internal::dense_product_base::operator_cast_to_double(this_02);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,(Index)row,0x1247831);
  *pSVar2 = SVar4 + *pSVar2;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this_00
             ,other);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other);
  SVar4 = Eigen::internal::dense_product_base::operator_cast_to_double(this_02);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,(Index)row,0x1247902);
  *pSVar2 = SVar4;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_01,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_01,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)this_00);
  SVar3 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)this_00);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,(Index)row,0x12479fc);
  *pSVar2 = SVar3 + *pSVar2;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this_00
             ,other);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other);
  SVar4 = Eigen::internal::dense_product_base::operator_cast_to_double(this_02);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,(Index)row,0x1247acb);
  *pSVar2 = SVar4 + *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,(Index)row,0x1247af2);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,(Index)row,0x1247b15);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,(Index)row,0x1247b38);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,(Index)row,0x1247b5b);
  *pSVar2 = SVar1;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,(Index)row,0x1247b7f);
  SVar1 = *pSVar2;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,(Index)row,0x1247ba3);
  *pSVar2 = SVar1;
  return in_RDI;
}

Assistant:

Eigen::Matrix3d
opengv::relative_pose::modules::eigensolver::composeM(
  const Eigen::Matrix3d & xxF,
  const Eigen::Matrix3d & yyF,
  const Eigen::Matrix3d & zzF,
  const Eigen::Matrix3d & xyF,
  const Eigen::Matrix3d & yzF,
  const Eigen::Matrix3d & zxF,
  const cayley_t & cayley)
{
  Eigen::Matrix3d M;
  rotation_t R = math::cayley2rot_reduced(cayley);

  //Fill the matrix M using the precomputed summation terms
  double temp;
  temp =      R.row(2)*yyF*R.row(2).transpose();
  M(0,0)  = temp;
  temp = -2.0*R.row(2)*yzF*R.row(1).transpose();
  M(0,0) += temp;
  temp =      R.row(1)*zzF*R.row(1).transpose();
  M(0,0) += temp;

  temp =      R.row(2)*yzF*R.row(0).transpose();
  M(0,1)  = temp;
  temp = -1.0*R.row(2)*xyF*R.row(2).transpose();
  M(0,1) += temp;
  temp = -1.0*R.row(1)*zzF*R.row(0).transpose();
  M(0,1) += temp;
  temp =      R.row(1)*zxF*R.row(2).transpose();
  M(0,1) += temp;

  temp =      R.row(2)*xyF*R.row(1).transpose();
  M(0,2)  = temp;
  temp = -1.0*R.row(2)*yyF*R.row(0).transpose();
  M(0,2) += temp;
  temp = -1.0*R.row(1)*zxF*R.row(1).transpose();
  M(0,2) += temp;
  temp =      R.row(1)*yzF*R.row(0).transpose();
  M(0,2) += temp;

  temp =      R.row(0)*zzF*R.row(0).transpose();
  M(1,1)  = temp;
  temp = -2.0*R.row(0)*zxF*R.row(2).transpose();
  M(1,1) += temp;
  temp =      R.row(2)*xxF*R.row(2).transpose();
  M(1,1) += temp;

  temp =      R.row(0)*zxF*R.row(1).transpose();
  M(1,2)  = temp;
  temp = -1.0*R.row(0)*yzF*R.row(0).transpose();
  M(1,2) += temp;
  temp = -1.0*R.row(2)*xxF*R.row(1).transpose();
  M(1,2) += temp;
  temp =      R.row(2)*xyF*R.row(0).transpose();
  M(1,2) += temp;

  temp =      R.row(1)*xxF*R.row(1).transpose();
  M(2,2)  = temp;
  temp = -2.0*R.row(0)*xyF*R.row(1).transpose();
  M(2,2) += temp;
  temp =      R.row(0)*yyF*R.row(0).transpose();
  M(2,2) += temp;

  M(1,0) = M(0,1);
  M(2,0) = M(0,2);
  M(2,1) = M(1,2);

  return M;
}